

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool New_Profile(black_PWorker worker,TStates aState,Bool overshoot)

{
  Bool overshoot_local;
  TStates aState_local;
  black_PWorker worker_local;
  
  if (worker->fProfile == (PProfile_conflict)0x0) {
    worker->cProfile = (PProfile_conflict)worker->top;
    worker->fProfile = worker->cProfile;
    worker->top = worker->top + 8;
  }
  if (worker->top < worker->maxBuff) {
    worker->cProfile->start = 0;
    worker->cProfile->height = 0;
    worker->cProfile->offset = worker->top;
    worker->cProfile->link = (PProfile)0x0;
    worker->cProfile->next = (PProfile)0x0;
    worker->cProfile->flags = (ushort)worker->dropOutControl;
    if (aState == Ascending_State) {
      worker->cProfile->flags = worker->cProfile->flags | 8;
      if (overshoot != '\0') {
        worker->cProfile->flags = worker->cProfile->flags | 0x20;
      }
    }
    else {
      if (aState != Descending_State) {
        worker->error = 0x14;
        return '\x01';
      }
      if (overshoot != '\0') {
        worker->cProfile->flags = worker->cProfile->flags | 0x10;
      }
    }
    if (worker->gProfile == (PProfile_conflict)0x0) {
      worker->gProfile = worker->cProfile;
    }
    worker->state = aState;
    worker->fresh = '\x01';
    worker->joint = '\0';
    worker_local._7_1_ = '\0';
  }
  else {
    worker->error = 0x62;
    worker_local._7_1_ = '\x01';
  }
  return worker_local._7_1_;
}

Assistant:

static Bool
  New_Profile( RAS_ARGS TStates  aState,
                        Bool     overshoot )
  {
    if ( !ras.fProfile )
    {
      ras.cProfile  = (PProfile)ras.top;
      ras.fProfile  = ras.cProfile;
      ras.top      += AlignProfileSize;
    }

    if ( ras.top >= ras.maxBuff )
    {
      ras.error = FT_THROW( Raster_Overflow );
      return FAILURE;
    }

    ras.cProfile->start  = 0;
    ras.cProfile->height = 0;
    ras.cProfile->offset = ras.top;
    ras.cProfile->link   = (PProfile)0;
    ras.cProfile->next   = (PProfile)0;
    ras.cProfile->flags  = ras.dropOutControl;

    switch ( aState )
    {
    case Ascending_State:
      ras.cProfile->flags |= Flow_Up;
      if ( overshoot )
        ras.cProfile->flags |= Overshoot_Bottom;

      FT_TRACE6(( "  new ascending profile = %p\n", (void *)ras.cProfile ));
      break;

    case Descending_State:
      if ( overshoot )
        ras.cProfile->flags |= Overshoot_Top;
      FT_TRACE6(( "  new descending profile = %p\n", (void *)ras.cProfile ));
      break;

    default:
      FT_ERROR(( "New_Profile: invalid profile direction\n" ));
      ras.error = FT_THROW( Invalid_Outline );
      return FAILURE;
    }

    if ( !ras.gProfile )
      ras.gProfile = ras.cProfile;

    ras.state = aState;
    ras.fresh = TRUE;
    ras.joint = FALSE;

    return SUCCESS;
  }